

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uttt.h
# Opt level: O0

vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> * __thiscall
uttt::IBoardReader::operator()(IBoardReader *this,vector<char,_std::allocator<char>_> *bytes)

{
  byte bVar1;
  byte bVar2;
  value_type_conflict2 vVar3;
  size_type sVar4;
  reference pvVar5;
  byte *pbVar6;
  reference pvVar7;
  vector<char,_std::allocator<char>_> *in_RDX;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *in_RDI;
  value_type *it;
  value_type *b;
  unsigned_long_long offset;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *boards;
  undefined6 in_stack_ffffffffffffff78;
  value_type_conflict2 in_stack_ffffffffffffff80;
  value_type_conflict2 in_stack_ffffffffffffff82;
  value_type_conflict2 in_stack_ffffffffffffff84;
  value_type_conflict2 in_stack_ffffffffffffff86;
  allocator_type *in_stack_ffffffffffffff90;
  ulong uVar8;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *this_00;
  ulong local_38;
  
  this_00 = in_RDI;
  std::vector<char,_std::allocator<char>_>::size(in_RDX);
  std::allocator<uttt::IBoard>::allocator((allocator<uttt::IBoard> *)0x2431ea);
  std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
            (this_00,(size_type)in_RDI,in_stack_ffffffffffffff90);
  std::allocator<uttt::IBoard>::~allocator((allocator<uttt::IBoard> *)0x24320a);
  local_38 = 0;
  while (uVar8 = local_38, sVar4 = std::vector<char,_std::allocator<char>_>::size(in_RDX),
        uVar8 < sVar4) {
    pvVar5 = std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::operator[]
                       (this_00,local_38 / 0x18);
    pbVar6 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](in_RDX,local_38);
    pvVar5->macro =
         (uint)*pbVar6 << 0x18 | (uint)pbVar6[1] << 0x10 | (uint)pbVar6[2] << 8 | (uint)pbVar6[3];
    vVar3 = CONCAT11(pbVar6[4],pbVar6[5]);
    pvVar7 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)
                        CONCAT26(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,
                                          CONCAT22(in_stack_ffffffffffffff82,
                                                   in_stack_ffffffffffffff80))),
                        CONCAT26(vVar3,in_stack_ffffffffffffff78));
    *pvVar7 = vVar3;
    in_stack_ffffffffffffff80 = CONCAT11(pbVar6[6],pbVar6[7]);
    pvVar7 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)
                        CONCAT26(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,
                                          CONCAT22(in_stack_ffffffffffffff82,
                                                   in_stack_ffffffffffffff80))),
                        CONCAT26(vVar3,in_stack_ffffffffffffff78));
    *pvVar7 = in_stack_ffffffffffffff80;
    in_stack_ffffffffffffff82 = CONCAT11(pbVar6[8],pbVar6[9]);
    pvVar7 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)
                        CONCAT26(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,
                                          CONCAT22(in_stack_ffffffffffffff82,
                                                   in_stack_ffffffffffffff80))),
                        CONCAT26(vVar3,in_stack_ffffffffffffff78));
    *pvVar7 = in_stack_ffffffffffffff82;
    in_stack_ffffffffffffff84 = CONCAT11(pbVar6[10],pbVar6[0xb]);
    pvVar7 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)
                        CONCAT26(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,
                                          CONCAT22(in_stack_ffffffffffffff82,
                                                   in_stack_ffffffffffffff80))),
                        CONCAT26(vVar3,in_stack_ffffffffffffff78));
    *pvVar7 = in_stack_ffffffffffffff84;
    in_stack_ffffffffffffff86 = CONCAT11(pbVar6[0xc],pbVar6[0xd]);
    pvVar7 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)
                        CONCAT26(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,
                                          CONCAT22(in_stack_ffffffffffffff82,
                                                   in_stack_ffffffffffffff80))),
                        CONCAT26(vVar3,in_stack_ffffffffffffff78));
    *pvVar7 = in_stack_ffffffffffffff86;
    bVar1 = pbVar6[0xe];
    bVar2 = pbVar6[0xf];
    pvVar7 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)
                        CONCAT26(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,
                                          CONCAT22(in_stack_ffffffffffffff82,
                                                   in_stack_ffffffffffffff80))),
                        CONCAT26(vVar3,in_stack_ffffffffffffff78));
    *pvVar7 = CONCAT11(bVar1,bVar2);
    bVar1 = pbVar6[0x10];
    bVar2 = pbVar6[0x11];
    pvVar7 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)
                        CONCAT26(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,
                                          CONCAT22(in_stack_ffffffffffffff82,
                                                   in_stack_ffffffffffffff80))),
                        CONCAT26(vVar3,in_stack_ffffffffffffff78));
    *pvVar7 = CONCAT11(bVar1,bVar2);
    bVar1 = pbVar6[0x12];
    bVar2 = pbVar6[0x13];
    pvVar7 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)
                        CONCAT26(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,
                                          CONCAT22(in_stack_ffffffffffffff82,
                                                   in_stack_ffffffffffffff80))),
                        CONCAT26(vVar3,in_stack_ffffffffffffff78));
    *pvVar7 = CONCAT11(bVar1,bVar2);
    bVar1 = pbVar6[0x14];
    bVar2 = pbVar6[0x15];
    pvVar7 = std::array<short,_9UL>::operator[]
                       ((array<short,_9UL> *)
                        CONCAT26(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,
                                          CONCAT22(in_stack_ffffffffffffff82,
                                                   in_stack_ffffffffffffff80))),
                        CONCAT26(vVar3,in_stack_ffffffffffffff78));
    *pvVar7 = CONCAT11(bVar1,bVar2);
    pvVar5->next = pbVar6[0x16];
    pvVar5->player = pbVar6[0x17];
    local_38 = local_38 + 0x18;
  }
  return in_RDI;
}

Assistant:

std::vector<IBoard> operator()(const std::vector<char> &bytes) const
    {
        std::vector<IBoard> boards(bytes.size() / IBoardSize);
        for (unsigned long long offset = 0; offset < bytes.size(); offset += IBoardSize)
        {
            auto &b = boards[offset / IBoardSize];
            auto it = &bytes[offset];
            b.macro = (uint8_t(it[0]) << 24) | (uint8_t(it[1]) << 16) | (uint8_t(it[2]) << 8) | uint8_t(it[3]);
            b.micro[0] = (uint8_t(it[4]) << 8) | uint8_t(it[5]);
            b.micro[1] = (uint8_t(it[6]) << 8) | uint8_t(it[7]);
            b.micro[2] = (uint8_t(it[8]) << 8) | uint8_t(it[9]);
            b.micro[3] = (uint8_t(it[10]) << 8) | uint8_t(it[11]);
            b.micro[4] = (uint8_t(it[12]) << 8) | uint8_t(it[13]);
            b.micro[5] = (uint8_t(it[14]) << 8) | uint8_t(it[15]);
            b.micro[6] = (uint8_t(it[16]) << 8) | uint8_t(it[17]);
            b.micro[7] = (uint8_t(it[18]) << 8) | uint8_t(it[19]);
            b.micro[8] = (uint8_t(it[20]) << 8) | uint8_t(it[21]);
            b.next = it[22];
            b.player = it[23];
        }
        return boards;
    }